

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::MpVarint<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  ushort uVar2;
  uint32_t *data_00;
  byte *pbVar3;
  bool bVar4;
  uint32_t has_idx;
  char *pcVar5;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  string *psVar6;
  uint uVar7;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar8;
  ParseContext *pPVar9;
  ushort *puVar10;
  uint uVar11;
  ulong *puVar12;
  undefined4 *puVar13;
  uint value;
  ulong uVar14;
  uint uVar15;
  FieldEntry *entry;
  uint *puVar16;
  LogMessageFatal local_40 [16];
  
  entry = (FieldEntry *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)entry & 3) != 0) {
    AlignFail(entry);
  }
  uVar2 = entry->type_card;
  uVar15 = uVar2 & 0x30;
  if (uVar15 == 0x20) {
    pcVar5 = MpRepeatedVarint<false>(msg,ptr,ctx,data,table,hasbits);
    return pcVar5;
  }
  if (((ulong)data.field_0 & 7) == 0) {
    uVar14 = (ulong)*ptr;
    if ((long)uVar14 < 0) {
      aVar8.data = (long)ptr[1] << 7 | 0x7f;
      if ((long)aVar8 < 0) {
        pPVar9 = (ParseContext *)((long)ptr[2] << 0xe | 0x3fff);
        if ((long)pPVar9 < 0) {
          aVar8.data = aVar8.data & ((long)ptr[3] << 0x15 | 0x1fffffU);
          if ((long)aVar8 < 0) {
            pPVar9 = (ParseContext *)((ulong)pPVar9 & ((long)ptr[4] << 0x1c | 0xfffffffU));
            if ((long)pPVar9 < 0) {
              aVar8.data = aVar8.data & ((long)ptr[5] << 0x23 | 0x7ffffffffU);
              if ((long)aVar8 < 0) {
                pPVar9 = (ParseContext *)((ulong)pPVar9 & ((long)ptr[6] << 0x2a | 0x3ffffffffffU));
                if ((long)pPVar9 < 0) {
                  aVar8.data = aVar8.data & ((long)ptr[7] << 0x31 | 0x1ffffffffffffU);
                  if ((long)aVar8 < 0) {
                    pPVar9 = (ParseContext *)
                             ((ulong)pPVar9 & ((ulong)(byte)ptr[8] << 0x38 | 0xffffffffffffff));
                    if ((long)pPVar9 < 0) {
                      puVar10 = (ushort *)(ptr + 10);
                      bVar1 = ptr[9];
                      if (bVar1 != 1) {
                        if ((char)bVar1 < '\0') {
                          pcVar5 = Error(msg,(char *)CONCAT71(0xffffffffffffff,bVar1),pPVar9,
                                         (TcFieldData)aVar8,table,hasbits);
                          return pcVar5;
                        }
                        if ((bVar1 & 1) == 0) {
                          pPVar9 = (ParseContext *)((ulong)pPVar9 ^ 0x8000000000000000);
                        }
                      }
                    }
                    else {
                      puVar10 = (ushort *)(ptr + 9);
                    }
                  }
                  else {
                    puVar10 = (ushort *)(ptr + 8);
                  }
                }
                else {
                  puVar10 = (ushort *)(ptr + 7);
                }
              }
              else {
                puVar10 = (ushort *)(ptr + 6);
              }
            }
            else {
              puVar10 = (ushort *)(ptr + 5);
            }
          }
          else {
            puVar10 = (ushort *)(ptr + 4);
          }
        }
        else {
          puVar10 = (ushort *)(ptr + 3);
        }
        aVar8.data = aVar8.data & (ulong)pPVar9;
      }
      else {
        puVar10 = (ushort *)(ptr + 2);
      }
      uVar14 = uVar14 & aVar8.data;
    }
    else {
      puVar10 = (ushort *)(ptr + 1);
    }
    uVar7 = uVar2 & 0x600;
    pPVar9 = (ParseContext *)(ulong)uVar7;
    uVar11 = uVar2 & 0x1c0;
    value = (uint)uVar14;
    if ((ulong)uVar11 == 0xc0) {
      if (uVar7 == 0x200) {
        uVar14 = -(ulong)(value & 1) ^ uVar14 >> 1;
      }
    }
    else if (uVar11 == 0x80) {
      if ((uVar2 >> 10 & 1) == 0) {
        if (uVar7 == 0x200) {
          uVar14 = (ulong)(int)(-(value & 1) ^ (uint)(uVar14 >> 1) & 0x7fffffff);
        }
      }
      else {
        data_00 = *(uint32_t **)
                   ((long)&table->has_bits_offset +
                   (ulong)entry->aux_idx * 8 + (ulong)table->aux_offset);
        if (uVar7 == 0x600) {
          if (((int)value < (int)(short)data_00) ||
             ((int)((int)(short)data_00 + ((uint)((ulong)data_00 >> 0x10) & 0xffff)) <= (int)value))
          {
LAB_00296a1a:
            pcVar5 = MpUnknownEnumFallback(msg,ptr,ctx,data,table,hasbits);
            return pcVar5;
          }
        }
        else {
          bVar4 = ValidateEnum(value,data_00);
          if (!bVar4) goto LAB_00296a1a;
        }
      }
    }
    if (uVar15 == 0x30) {
      ChangeOneof(table,entry,(uint)((ulong)data.field_0 >> 3) & 0x1fffffff,pPVar9,msg);
    }
    else if (uVar15 == 0x10) {
      pbVar3 = (byte *)((long)&msg->_vptr_MessageLite + ((long)entry->has_idx >> 3));
      *pbVar3 = *pbVar3 | '\x01' << (entry->has_idx & 7U);
    }
    if (uVar11 == 0xc0) {
      puVar12 = (ulong *)((long)&msg->_vptr_MessageLite + (ulong)entry->offset);
      if (((ulong)puVar12 & 7) != 0) {
        AlignFail();
      }
      *puVar12 = uVar14;
    }
    else if (uVar11 == 0x80) {
      puVar13 = (undefined4 *)((long)&msg->_vptr_MessageLite + (ulong)entry->offset);
      if (((ulong)puVar13 & 3) != 0) {
        AlignFail();
      }
      *puVar13 = (int)uVar14;
    }
    else {
      if ((uVar2 & 0x1c0) != 0) {
        psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           ((ulong)uVar11,0,"rep == static_cast<uint16_t>(field_layout::kRep8Bits)")
        ;
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x76d,*(undefined8 *)(psVar6 + 8),*(undefined8 *)psVar6);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
      }
      *(bool *)((long)&msg->_vptr_MessageLite + (ulong)entry->offset) = uVar14 != 0;
    }
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar10) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar16 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar16 & 3) != 0) {
          AlignFail(puVar16);
        }
        *puVar16 = *puVar16 | (uint)hasbits;
      }
      return (char *)puVar10;
    }
    uVar15 = (uint)table->fast_idx_mask & (uint)*puVar10;
    if ((uVar15 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
    uVar14 = (ulong)(uVar15 & 0xfffffff8);
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   ((ulong)*puVar10 ^ *(ulong *)(&table[1].fast_idx_mask + uVar14 * 2));
    UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar14);
  }
  else {
    UNRECOVERED_JUMPTABLE = table->fallback;
    puVar10 = (ushort *)ptr;
  }
  pcVar5 = (*UNRECOVERED_JUMPTABLE)(msg,(char *)puVar10,ctx,data,table,hasbits);
  return pcVar5;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpVarint(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint16_t card = type_card & field_layout::kFcMask;

  // Check for repeated parsing:
  if (card == field_layout::kFcRepeated) {
    PROTOBUF_MUSTTAIL return MpRepeatedVarint<is_split>(PROTOBUF_TC_PARAM_PASS);
  }
  // Check for wire type mismatch:
  if ((data.tag() & 7) != WireFormatLite::WIRETYPE_VARINT) {
    PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
  }
  const uint16_t xform_val = type_card & field_layout::kTvMask;
  const bool is_zigzag = xform_val == field_layout::kTvZigZag;
  const bool is_validated_enum = xform_val & field_layout::kTvEnum;

  // Parse the value:
  const char* ptr2 = ptr;  // save for unknown enum case
  uint64_t tmp;
  ptr = ParseVarint(ptr, &tmp);
  if (ptr == nullptr) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }

  // Transform and/or validate the value
  uint16_t rep = type_card & field_layout::kRepMask;
  if (rep == field_layout::kRep64Bits) {
    if (is_zigzag) {
      tmp = WireFormatLite::ZigZagDecode64(tmp);
    }
  } else if (rep == field_layout::kRep32Bits) {
    if (is_validated_enum) {
      if (!EnumIsValidAux(tmp, xform_val, *table->field_aux(&entry))) {
        ptr = ptr2;
        PROTOBUF_MUSTTAIL return MpUnknownEnumFallback(PROTOBUF_TC_PARAM_PASS);
      }
    } else if (is_zigzag) {
      tmp = WireFormatLite::ZigZagDecode32(static_cast<uint32_t>(tmp));
    }
  }

  // Mark the field as present:
  const bool is_oneof = card == field_layout::kFcOneof;
  if (card == field_layout::kFcOptional) {
    SetHas(entry, msg);
  } else if (is_oneof) {
    ChangeOneof(table, entry, data.tag() >> 3, ctx, msg);
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  if (rep == field_layout::kRep64Bits) {
    RefAt<uint64_t>(base, entry.offset) = tmp;
  } else if (rep == field_layout::kRep32Bits) {
    RefAt<uint32_t>(base, entry.offset) = static_cast<uint32_t>(tmp);
  } else {
    ABSL_DCHECK_EQ(rep, static_cast<uint16_t>(field_layout::kRep8Bits));
    RefAt<bool>(base, entry.offset) = static_cast<bool>(tmp);
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}